

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_xywh.cxx
# Opt level: O0

int Fl::screen_num(int x,int y)

{
  int local_28;
  int local_24;
  int sh;
  int sw;
  int sy;
  int sx;
  int i;
  int screen;
  int y_local;
  int x_local;
  
  sx = 0;
  i = y;
  screen = x;
  if (num_screens < 0) {
    screen_init();
  }
  sy = 0;
  while( true ) {
    if (num_screens <= sy) {
      return sx;
    }
    sw = 0;
    sh = 0;
    local_24 = 0;
    local_28 = 0;
    screen_xywh(&sw,&sh,&local_24,&local_28,sy);
    if ((((sw <= screen) && (screen < sw + local_24)) && (sh <= i)) && (i < sh + local_28)) break;
    sy = sy + 1;
  }
  return sy;
}

Assistant:

int Fl::screen_num(int x, int y) {
  int screen = 0;
  if (num_screens < 0) screen_init();
  
  for (int i = 0; i < num_screens; i ++) {
    int sx = 0, sy = 0, sw = 0, sh = 0;
    Fl::screen_xywh(sx, sy, sw, sh, i);
    if ((x >= sx) && (x < (sx+sw)) && (y >= sy) && (y < (sy+sh))) {
      screen = i;
      break;
    }
  }
  return screen;
}